

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O3

void __thiscall
dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::any_function
          (any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL> *this,
          any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL> *item)

{
  _Head_base<0UL,_dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_*,_false>
  _Var1;
  pointer *__ptr;
  
  (this->data)._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_*,_std::default_delete<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_>_>
  .
  super__Head_base<0UL,_dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_*,_false>
  ._M_head_impl = (Tbase<void_(const_dlib::vector<double,_3L>_&)> *)0x0;
  _Var1._M_head_impl =
       (item->data)._M_t.
       super___uniq_ptr_impl<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_*,_std::default_delete<dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_>_>
       .
       super__Head_base<0UL,_dlib::any_function<void_(const_dlib::vector<double,_3L>_&),_void,_1UL>::Tbase<void_(const_dlib::vector<double,_3L>_&)>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl != (Tbase<void_(const_dlib::vector<double,_3L>_&)> *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 0x18))(_Var1._M_head_impl,this);
  }
  return;
}

Assistant:

any_function (
    const any_function& item
)
{
    if (item.data)
    {
        item.data->copy_to(data);
    }
}